

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CGetFieldByThisExpression *exp)

{
  ISubtreeWrapper *pIVar1;
  string *currentClassName;
  _Alloc_hider _Var2;
  ISubtreeWrapper *pIVar3;
  IAddress *pIVar4;
  shared_ptr<VariableInfo> varInfo;
  string local_50;
  __buckets_ptr local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CGetFieldByThisExpression\n",0x27);
  pIVar3 = (ISubtreeWrapper *)operator_new(0x10);
  pIVar4 = IRT::CFrame::GetClassFieldAddress
                     (this->currentFrame,
                      &((exp->fieldIdentifier)._M_t.
                        super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                        super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                        super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
  (*pIVar4->_vptr_IAddress[2])(&local_50,pIVar4);
  _Var2._M_p = local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  pIVar3->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00183490;
  pIVar3[1]._vptr_ISubtreeWrapper = (_func_int **)_Var2._M_p;
  pIVar1 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar3;
  if (pIVar1 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar1);
  }
  if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_50._M_dataplus._M_p + 0x10))();
  }
  currentClassName = (string *)this->symbolTable;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  getVariableInfoFromLocalArgAndFields
            ((SymbolTable *)&stack0xffffffffffffffd0,currentClassName,&this->currentClassName,
             &local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (*(char *)&local_30[4]->_M_nxt == '\x01') {
    std::__cxx11::string::_M_replace
              ((ulong)&this->currentObjectClassName,0,
               (char *)(this->currentObjectClassName)._M_string_length,0x15c41a);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->currentObjectClassName);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CGetFieldByThisExpression &exp ) {
    std::cout << "IRT builder: CGetFieldByThisExpression\n";
    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            std::move( currentFrame->GetClassFieldAddress( exp.fieldIdentifier->name )->ToExpression( ))));

    auto varInfo = getVariableInfoFromLocalArgAndFields( symbolTable,
                                                         currentClassName,
                                                         "",
                                                         exp.fieldIdentifier->name );

    if ( varInfo->type->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = varInfo->type->className;
    }
}